

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp:302:58)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_object_object_cpp:302:58)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  value *v;
  void *pvVar1;
  object_ptr o;
  undefined1 local_30 [16];
  
  v = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  global_object::validate_object((global_object *)&stack0xffffffffffffffe0,v);
  pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&stack0xffffffffffffffe0);
  if (*(int *)((long)pvVar1 + 0x14) == 0) {
    local_30._0_8_ = (gc_heap *)0x0;
    local_30._8_4_ = 0;
  }
  else {
    gc_heap::unsafe_create_from_position<mjs::object>
              ((gc_heap *)local_30,(uint32_t)*(undefined8 *)((long)pvVar1 + 8));
    if ((gc_heap *)local_30._0_8_ != (gc_heap *)0x0) {
      __return_storage_ptr__->type_ = object;
      (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.
      super_gc_heap_ptr_untyped.heap_ = (gc_heap *)local_30._0_8_;
      *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 8) = local_30._8_4_;
      gc_heap::attach((gc_heap *)local_30._0_8_,
                      (gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
      goto LAB_00154f8c;
    }
  }
  value::value(__return_storage_ptr__,(value *)value::null);
LAB_00154f8c:
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_30);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffe0);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }